

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  DateTruncBinaryOperator *pDVar3;
  char *pcVar4;
  date_t dVar5;
  date_t *pdVar6;
  date_t *pdVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pDVar3 = *(DateTruncBinaryOperator **)&ldata->value;
      pcVar4 = (ldata->value).pointer.ptr;
      iVar11 = 0;
      iVar8 = count;
      do {
        specifier_01.value._8_4_ = rdata[iVar11].days;
        specifier_01.value._0_8_ = pcVar4;
        specifier_01.value._12_4_ = 0;
        dVar5 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                          (pDVar3,specifier_01,(int32_t)iVar8);
        result_data[iVar11].days = dVar5.days;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    pdVar6 = (date_t *)0x0;
    uVar12 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
LAB_00eec326:
        uVar10 = uVar12;
        if (uVar12 < uVar9) {
          pDVar3 = *(DateTruncBinaryOperator **)&ldata->value;
          pcVar4 = (ldata->value).pointer.ptr;
          pdVar7 = pdVar6;
          do {
            specifier.value._8_4_ = rdata[uVar12].days;
            specifier.value._0_8_ = pcVar4;
            specifier.value._12_4_ = 0;
            dVar5 = DateTruncBinaryOperator::
                    Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                              (pDVar3,specifier,(int32_t)pdVar7);
            result_data[uVar12].days = dVar5.days;
            uVar12 = uVar12 + 1;
            uVar10 = uVar9;
          } while (uVar9 != uVar12);
        }
      }
      else {
        uVar2 = puVar1[(long)pdVar6];
        uVar9 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar9 = count;
        }
        uVar10 = uVar9;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_00eec326;
          uVar10 = uVar12;
          if (uVar12 < uVar9) {
            uVar13 = 0;
            pdVar7 = pdVar6;
            do {
              if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                specifier_00.value._8_4_ = rdata[uVar12 + uVar13].days;
                specifier_00.value._0_8_ = (ldata->value).pointer.ptr;
                specifier_00.value._12_4_ = 0;
                dVar5 = DateTruncBinaryOperator::
                        Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                                  (*(DateTruncBinaryOperator **)&ldata->value,specifier_00,
                                   (int32_t)pdVar7);
                (result_data + uVar12)[uVar13].days = dVar5.days;
                pdVar7 = result_data + uVar12;
              }
              uVar13 = uVar13 + 1;
              uVar10 = uVar9;
            } while (uVar9 - uVar12 != uVar13);
          }
        }
      }
      pdVar6 = (date_t *)((long)&pdVar6->days + 1);
      uVar12 = uVar10;
    } while (pdVar6 != (date_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}